

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
process_final_deregs_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  bool bVar1;
  anon_class_8_1_a7c129e6 local_70;
  undefined1 local_68 [8];
  final_dereg_coop_container_t coops;
  unique_lock<std::mutex> *acquired_lock_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  
  coops.super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)acquired_lock;
  while( true ) {
    bVar1 = std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::empty
                      (&this->m_final_dereg_coops);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::deque
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)local_68);
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::swap
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)local_68,
               &this->m_final_dereg_coops);
    local_70.coops = (deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)local_68;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::process_final_deregs_if_any(std::unique_lock<std::mutex>&)::_lambda()_1_>
              ((unique_lock<std::mutex> *)
               coops.super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node,&local_70);
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::~deque
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)local_68);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::process_final_deregs_if_any(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		// This loop is necessary because it is possible that new
		// final dereg demand will be added during processing of
		// the current final dereg demand.
		while( !m_final_dereg_coops.empty() )
			{
				final_dereg_coop_container_t coops;
				coops.swap( m_final_dereg_coops );

				helpers::unlock_do_and_lock_again( acquired_lock,
					[&coops] {
						for( auto ptr : coops )
							coop_t::call_final_deregister_coop( ptr );
					} );
			}
	}